

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O3

vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *
discoverWithFilter(vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   *__return_storage_ptr__,DeviceFilter *filter)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pDVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  DeviceInfo *extraout_RDX;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __it2;
  DeviceInfo *extraout_RDX_00;
  DeviceInfo *extraout_RDX_01;
  DeviceInfo *extraout_RDX_02;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  _Var10;
  DeviceInfo *this;
  DeviceInfo *this_00;
  iterator __first;
  string *psVar11;
  DeviceInfo *pDVar12;
  DeviceInfo *info;
  iterator __last;
  pointer pDVar13;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *filtered_devices;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  Discover discover;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_78;
  Discover local_60;
  
  rcdiscover::Discover::Discover(&local_60);
  rcdiscover::Discover::broadcastRequest(&local_60);
  lVar7 = std::chrono::_V2::steady_clock::now();
  local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (DeviceInfo *)0x0;
  local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (DeviceInfo *)0x0;
  local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar8 = lVar7;
  while ((bVar6 = rcdiscover::Discover::getResponse(&local_60,&local_78,100),
         pDVar13 = local_78.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pDVar5 = local_78.
                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start, bVar6 ||
         ((double)(lVar8 - lVar7) / 1000000.0 < 1000.0))) {
    lVar8 = std::chrono::_V2::steady_clock::now();
  }
  __first._M_current =
       local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_78.
                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.
                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 8;
    lVar8 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pDVar5,pDVar13);
    __first._M_current =
         local_78.
         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl
         .super__Vector_impl_data._M_finish;
    __it2._M_current = extraout_RDX;
    _Var10._M_current =
         local_78.
         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl
         .super__Vector_impl_data._M_start;
    __last._M_current = __first._M_current;
    if (local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        this_00 = _Var10._M_current;
        _Var10._M_current = this_00 + 1;
        if (_Var10._M_current == __first._M_current) goto LAB_00113b7a;
        bVar6 = __gnu_cxx::__ops::_Iter_comp_iter<discoverWithFilter(DeviceFilter_const&)::$_0>::
                operator()(this_00,_Var10,__it2);
        __it2._M_current = extraout_RDX_00;
      } while (!bVar6);
      if (this_00 + 2 != __first._M_current) {
        _Var10._M_current = extraout_RDX_00;
        this = this_00;
        psVar11 = (string *)&this_00[2].user_name;
        do {
          bVar6 = __gnu_cxx::__ops::_Iter_comp_iter<discoverWithFilter(DeviceFilter_const&)::$_0>::
                  operator()(this,(DeviceInfo *)(psVar11 + -0xe0),_Var10);
          _Var10._M_current = extraout_RDX_01;
          this_00 = this;
          if (!bVar6) {
            this_00 = this + 1;
            std::__cxx11::string::operator=((string *)this_00,psVar11 + -0xe0);
            uVar1 = *(undefined8 *)(psVar11 + -0xc0);
            uVar2 = *(uint64_t *)(psVar11 + -0xb8);
            uVar3 = *(undefined8 *)(psVar11 + -0xb4);
            uVar4 = *(undefined8 *)(psVar11 + -0xac);
            this[1].major = (int)uVar1;
            this[1].minor = (int)((ulong)uVar1 >> 0x20);
            this[1].mac = uVar2;
            *(undefined8 *)((long)&this[1].mac + 4) = uVar3;
            this[1].subnet = (int)uVar4;
            this[1].gateway = (int)((ulong)uVar4 >> 0x20);
            std::__cxx11::string::operator=((string *)&this[1].manufacturer_name,psVar11 + -0xa0);
            std::__cxx11::string::operator=((string *)&this[1].model_name,psVar11 + -0x80);
            std::__cxx11::string::operator=((string *)&this[1].device_version,psVar11 + -0x60);
            std::__cxx11::string::operator=((string *)&this[1].manufacturer_info,psVar11 + -0x40);
            std::__cxx11::string::operator=((string *)&this[1].serial_number,psVar11 + -0x20);
            std::__cxx11::string::operator=((string *)&this[1].user_name,psVar11);
            _Var10._M_current = extraout_RDX_02;
          }
          pDVar12 = (DeviceInfo *)(psVar11 + 0x20);
          this = this_00;
          psVar11 = psVar11 + 0x100;
          __last._M_current =
               local_78.
               super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
        } while (pDVar12 != __first._M_current);
      }
      __first._M_current = this_00 + 1;
    }
  }
LAB_00113b7a:
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::_M_erase
            (&local_78,__first,__last);
  pDVar5 = local_78.
           super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pDVar13 = local_78.
                 super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pDVar13 != pDVar5; pDVar13 = pDVar13 + 1
      ) {
    bVar6 = filterDevice(pDVar13,filter);
    if (bVar6) {
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                (__return_storage_ptr__,pDVar13);
    }
  }
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&local_78);
  rcdiscover::Discover::~Discover(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<rcdiscover::DeviceInfo> discoverWithFilter(
    const DeviceFilter &filter)
{
  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  std::vector<rcdiscover::DeviceInfo> infos;
  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  infos.erase(std::unique(infos.begin(), infos.end(),
                          [](const rcdiscover::DeviceInfo &lhs,
                             const rcdiscover::DeviceInfo &rhs)
                          {
                            return lhs.getMAC() == rhs.getMAC() &&
                                   lhs.getIfaceName() == rhs.getIfaceName();
                          }), infos.end());

  std::vector<rcdiscover::DeviceInfo> filtered_devices;
  for (const auto &info : infos)
  {
    if (filterDevice(info, filter))
    {
      filtered_devices.push_back(info);
    }
  }
  return filtered_devices;
}